

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  bigit bVar3;
  bigit bVar4;
  ulong uVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bigit rhs_bigit;
  double_bigit sum;
  int i;
  int min_exp;
  double_bigit borrow;
  anon_class_1_0_00000001 get_bigit;
  int num_rhs_bigits;
  int max_lhs_bigits;
  anon_class_1_0_00000001 maximum;
  anon_class_1_0_00000001 minimum;
  undefined4 in_stack_ffffffffffffffb0;
  bigit in_stack_ffffffffffffffb4;
  bigint *in_stack_ffffffffffffffb8;
  long local_38;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            );
  iVar2 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffb4,iVar1));
  iVar2 = add_compare::anon_class_1_0_00000001::operator()(&local_22,iVar1,iVar2);
  iVar1 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffb4,iVar1));
  if (iVar2 + 1 < iVar1) {
    local_4 = -1;
  }
  else if (iVar1 < iVar2) {
    local_4 = 1;
  }
  else {
    local_38 = 0;
    iVar2 = add_compare::anon_class_1_0_00000001::operator()
                      (&local_21,*(int *)(local_10 + 0xa8),*(int *)(local_18 + 0xa8));
    iVar2 = add_compare::anon_class_1_0_00000001::operator()
                      (&local_21,iVar2,*(int *)(local_20 + 0xa8));
    while (iVar1 = iVar1 + -1, iVar2 <= iVar1) {
      bVar3 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb4);
      bVar4 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb4);
      in_stack_ffffffffffffffb8 = (bigint *)((ulong)bVar3 + (ulong)bVar4);
      in_stack_ffffffffffffffb4 =
           add_compare::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb4);
      if ((bigint *)((ulong)in_stack_ffffffffffffffb4 + local_38) < in_stack_ffffffffffffffb8) {
        return 1;
      }
      uVar5 = ((ulong)in_stack_ffffffffffffffb4 + local_38) - (long)in_stack_ffffffffffffffb8;
      if (1 < uVar5) {
        return -1;
      }
      local_38 = uVar5 << 0x20;
    }
    local_4 = 0;
    if (local_38 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR20 int add_compare(const bigint& lhs1, const bigint& lhs2,
                                         const bigint& rhs) {
    auto minimum = [](int a, int b) { return a < b ? a : b; };
    auto maximum = [](int a, int b) { return a > b ? a : b; };
    int max_lhs_bigits = maximum(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = minimum(minimum(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }